

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandPrintBuf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar2;
  FILE *__s;
  uint fVerbose;
  size_t __size;
  char *pcVar3;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    pAVar2 = Abc_FrameReadNtk(pAbc);
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      __s = (FILE *)pAbc->Err;
      pcVar3 = "There is no current network.\n";
      __size = 0x1d;
    }
    else {
      pAVar2 = Abc_FrameReadNtk(pAbc);
      if (pAVar2->ntkFunc == ABC_FUNC_MAP) {
        pAVar2 = Abc_FrameReadNtk(pAbc);
        iVar1 = Abc_SclCheckNtk(pAVar2,0);
        if (iVar1 != 0) {
          if ((pAbc->pLibScl != (void *)0x0) &&
             (iVar1 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar1 != 0)) {
            Abc_SclPrintBuffers((SC_Lib *)pAbc->pLibScl,pNtk,fVerbose);
            return 0;
          }
          Abc_Print(-1,"Library delay info is not available.\n");
          return 1;
        }
        __s = (FILE *)pAbc->Err;
        pcVar3 = "The current network is not in a topo order (run \"topo\").\n";
        __size = 0x39;
      }
      else {
        __s = (FILE *)pAbc->Err;
        pcVar3 = "The current network is not mapped.\n";
        __size = 0x23;
      }
    }
  }
  else {
    fwrite("usage: print_buf [-vh]\n",0x17,1,(FILE *)pAbc->Err);
    fwrite("\t           prints buffers trees of the current design\n",0x37,1,(FILE *)pAbc->Err);
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
            pcVar3);
    __s = (FILE *)pAbc->Err;
    pcVar3 = "\t-h       : print the command usage\n";
    __size = 0x24;
  }
  fwrite(pcVar3,__size,1,__s);
  return 1;
}

Assistant:

int Scl_CommandPrintBuf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }

    Abc_SclPrintBuffers( (SC_Lib *)pAbc->pLibScl, pNtk, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: print_buf [-vh]\n" );
    fprintf( pAbc->Err, "\t           prints buffers trees of the current design\n" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}